

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.h
# Opt level: O3

void __thiscall
skiwi::environment<skiwi::environment_entry>::push_outer
          (environment<skiwi::environment_entry> *this,string *name,environment_entry e)

{
  element_type *peVar1;
  mapped_type *pmVar2;
  element_type *peVar3;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = (this->p_outer).
            super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_00 == (element_type *)0x0) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
             ::operator[](&this->env,name);
    pmVar2->st = e.st;
    *(undefined4 *)&pmVar2->field_0x4 = e._4_4_;
    pmVar2->pos = e.pos;
    (pmVar2->live_range).first = e.live_range.first;
    (pmVar2->live_range).last = e.live_range.last;
  }
  else {
    local_20._M_pi =
         (this->p_outer).
         super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_20._M_pi)->_M_use_count = (local_20._M_pi)->_M_use_count + 1;
      }
    }
    peVar1 = (this_00->p_outer).
             super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      peVar3 = this_00;
      do {
        this_00 = peVar1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_20,
                   &(peVar3->p_outer).
                    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        peVar1 = (this_00->p_outer).
                 super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        peVar3 = this_00;
      } while (peVar1 != (element_type *)0x0);
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::environment_entry>_>_>
             ::operator[](&this_00->env,name);
    (pmVar2->live_range).first = e.live_range.first;
    (pmVar2->live_range).last = e.live_range.last;
    pmVar2->st = e.st;
    *(undefined4 *)&pmVar2->field_0x4 = e._4_4_;
    pmVar2->pos = e.pos;
    if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
    }
  }
  return;
}

Assistant:

void push_outer(const std::string& name, TEntry e)
      {
      /*
      if (p_outer)
        p_outer->push_outer(name, e);
      else
        env[name] = e;
      */
      if (p_outer)
        {
        auto p_outer_copy = p_outer;
        while (p_outer_copy->p_outer)
          p_outer_copy = p_outer_copy->p_outer;
        p_outer_copy->env[name] = e;
        }
      else
        env[name] = e;
      }